

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wlnNtk.c
# Opt level: O3

void Wln_NtkPrint(Wln_Ntk_t *p)

{
  int iObj;
  
  printf("Printing %d objects of network \"%s\":\n",(ulong)(uint)(p->vTypes).nSize,p->pName);
  if (1 < (p->vTypes).nSize) {
    iObj = 1;
    do {
      Wln_ObjPrint(p,iObj);
      iObj = iObj + 1;
    } while (iObj < (p->vTypes).nSize);
  }
  putchar(10);
  return;
}

Assistant:

void Wln_NtkPrint( Wln_Ntk_t * p )
{
    int iObj;
    printf( "Printing %d objects of network \"%s\":\n", Wln_NtkObjNum(p), p->pName );
    Wln_NtkForEachObj( p, iObj )
        Wln_ObjPrint( p, iObj );
    printf( "\n" );
}